

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckArrayEqualTrue::RunImpl(TestCheckArrayEqualTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  int local_68 [2];
  TestDetails local_60;
  int array [3];
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  array[0] = 1;
  array[1] = 2;
  array[2] = 3;
  UnitTest::TestDetails::TestDetails(&local_60,"","","",0);
  UnitTest::CheckArrayEqual<int[3],int[3]>(&results,&array,&array,3,&local_60);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_68[1] = 0;
  local_68[0] = UnitTest::TestResults::GetFailureCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0xbe);
  UnitTest::CheckEqual<int,int>(results_00,local_68 + 1,local_68,&local_60);
  return;
}

Assistant:

TEST(CheckArrayEqualTrue)
{
    TestResults results;

    int const array[3] = { 1, 2, 3 };
    CheckArrayEqual(results, array, array, 3, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}